

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall
GlobOptBlockData::RemoveUnavailableCandidates(GlobOptBlockData *this,PRECandidates *candidates)

{
  ValueNumber VVar1;
  Sym *sym;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  BOOLEAN BVar5;
  Type *ppHVar6;
  PropertySym *sym_00;
  Value *pVVar7;
  undefined1 local_58 [8];
  EditingIterator iter;
  
  local_58 = (undefined1  [8])candidates->candidatesList;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount> *)local_58;
  iter.super_EditingIterator.last = (NodeBase *)__tls_get_addr(&PTR_013e5f18);
  do {
    do {
      bVar4 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)local_58);
      if (!bVar4) {
        return;
      }
      ppHVar6 = SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_58);
      pVVar7 = (*ppHVar6)->element;
      sym_00 = Sym::AsPropertySym((*ppHVar6)->value);
      VVar1 = pVVar7->valueNumber;
      sym = pVVar7->valueInfo->symStore;
      pVVar7 = FindValue(this,&sym_00->super_Sym);
    } while ((((pVVar7 != (Value *)0x0) && (pVVar7->valueNumber == VVar1)) &&
             (pVVar7->valueInfo->symStore == sym)) &&
            ((pVVar7 = FindValue(this,sym), pVVar7 != (Value *)0x0 && (pVVar7->valueNumber == VVar1)
             )));
    SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::EditingIterator::
    RemoveCurrent((EditingIterator *)local_58);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                      (candidates->candidatesToProcess,(sym_00->super_Sym).m_id);
    if (BVar5 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pNVar3 = iter.super_EditingIterator.last;
      *(undefined4 *)&(iter.super_EditingIterator.last)->next = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x16d,
                         "(candidates->candidatesToProcess->Test(candidatePropertySym->m_id))",
                         "candidates->candidatesToProcess->Test(candidatePropertySym->m_id)");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)&pNVar3->next = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear
              (candidates->candidatesToProcess,(sym_00->super_Sym).m_id);
  } while( true );
}

Assistant:

void GlobOptBlockData::RemoveUnavailableCandidates(PRECandidates * candidates)
{
    // In case of multiple back-edges to the loop, make sure the candidates are still valid.
    FOREACH_SLIST_ENTRY_EDITING(GlobHashBucket*, candidate, candidates->candidatesList, iter)
    {
        Value *candidateValue = candidate->element;
        PropertySym *candidatePropertySym = candidate->value->AsPropertySym();
        ValueNumber valueNumber = candidateValue->GetValueNumber();
        Sym *symStore = candidateValue->GetValueInfo()->GetSymStore();

        Value *blockValue = this->FindValue(candidatePropertySym);

        if (blockValue && blockValue->GetValueNumber() == valueNumber
            && blockValue->GetValueInfo()->GetSymStore() == symStore)
        {
            Value *symStoreValue = this->FindValue(symStore);

            if (symStoreValue && symStoreValue->GetValueNumber() == valueNumber)
            {
                continue;
            }
        }

        iter.RemoveCurrent();
        Assert(candidates->candidatesToProcess->Test(candidatePropertySym->m_id));
        candidates->candidatesToProcess->Clear(candidatePropertySym->m_id);
    } NEXT_SLIST_ENTRY_EDITING;
}